

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::GetAddressesFromMultisigResponse::GetAddressesFromMultisigResponse
          (GetAddressesFromMultisigResponse *this)

{
  GetAddressesFromMultisigResponse *this_local;
  
  core::JsonClassBase<cfd::js::api::json::GetAddressesFromMultisigResponse>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::GetAddressesFromMultisigResponse>);
  (this->super_JsonClassBase<cfd::js::api::json::GetAddressesFromMultisigResponse>).
  _vptr_JsonClassBase = (_func_int **)&PTR__GetAddressesFromMultisigResponse_01b3bf60;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->addresses_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->pubkeys_);
  this->require_num_ = 0;
  CollectFieldName();
  return;
}

Assistant:

GetAddressesFromMultisigResponse() {
    CollectFieldName();
  }